

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitorTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSocketMonitorTests::TestUnsignal_SocketDoesNotExist_WriteSocketErased::
TestUnsignal_SocketDoesNotExist_WriteSocketErased
          (TestUnsignal_SocketDoesNotExist_WriteSocketErased *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"Unsignal_SocketDoesNotExist_WriteSocketErased","SocketMonitorTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/SocketMonitorTestCase.cpp"
             ,0x5f);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00321110;
  return;
}

Assistant:

TEST(Unsignal_SocketDoesNotExist_WriteSocketErased)
{
  SocketMonitor monitor;
  TestStrategy strategy;

  int socket = 101;
  monitor.addRead(socket);
  monitor.addConnect(socket);

  monitor.signal(socket);
  monitor.unsignal(socket);

  socket_close(socket);
}